

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

QString * __thiscall QConfFileSettingsPrivate::fileName(QConfFileSettingsPrivate *this)

{
  bool bVar1;
  QList<QConfFile_*> *in_RDI;
  QList<QConfFile_*> *this_00;
  
  this_00 = in_RDI;
  bVar1 = QList<QConfFile_*>::isEmpty((QList<QConfFile_*> *)0x7afcb4);
  if (bVar1) {
    QString::QString((QString *)0x7afcc3);
  }
  else {
    QList<QConfFile_*>::at(this_00,(qsizetype)in_RDI);
    QString::QString((QString *)this_00,(QString *)in_RDI);
  }
  return (QString *)this_00;
}

Assistant:

QString QConfFileSettingsPrivate::fileName() const
{
    if (confFiles.isEmpty())
        return QString();

    // Note: First config file is always the most specific.
    return confFiles.at(0)->name;
}